

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t xor_uint16(uint16_t *array_1,int32_t card_1,uint16_t *array_2,int32_t card_2,uint16_t *out)

{
  ushort uVar1;
  ushort uVar2;
  size_t n_elems_1;
  size_t n_elems;
  uint16_t v2;
  uint16_t v1;
  int32_t pos_out;
  int32_t pos2;
  int32_t pos1;
  uint16_t *out_local;
  int32_t card_2_local;
  uint16_t *array_2_local;
  int32_t card_1_local;
  uint16_t *array_1_local;
  
  pos_out = 0;
  _v2 = 0;
  n_elems._4_4_ = 0;
  while (pos_out < card_1 && _v2 < card_2) {
    uVar1 = array_1[pos_out];
    uVar2 = array_2[_v2];
    if (uVar1 == uVar2) {
      pos_out = pos_out + 1;
      _v2 = _v2 + 1;
    }
    else {
      if (uVar1 < uVar2) {
        out[n_elems._4_4_] = uVar1;
        pos_out = pos_out + 1;
      }
      else {
        out[n_elems._4_4_] = uVar2;
        _v2 = _v2 + 1;
      }
      n_elems._4_4_ = n_elems._4_4_ + 1;
    }
  }
  if (pos_out < card_1) {
    memcpy(out + n_elems._4_4_,array_1 + pos_out,(long)(card_1 - pos_out) << 1);
    n_elems._4_4_ = (card_1 - pos_out) + n_elems._4_4_;
  }
  else if (_v2 < card_2) {
    memcpy(out + n_elems._4_4_,array_2 + _v2,(long)(card_2 - _v2) << 1);
    n_elems._4_4_ = (card_2 - _v2) + n_elems._4_4_;
  }
  return n_elems._4_4_;
}

Assistant:

int32_t xor_uint16(const uint16_t *array_1, int32_t card_1,
                   const uint16_t *array_2, int32_t card_2, uint16_t *out) {
    int32_t pos1 = 0, pos2 = 0, pos_out = 0;
    while (pos1 < card_1 && pos2 < card_2) {
        const uint16_t v1 = array_1[pos1];
        const uint16_t v2 = array_2[pos2];
        if (v1 == v2) {
            ++pos1;
            ++pos2;
            continue;
        }
        if (v1 < v2) {
            out[pos_out++] = v1;
            ++pos1;
        } else {
            out[pos_out++] = v2;
            ++pos2;
        }
    }
    if (pos1 < card_1) {
        const size_t n_elems = card_1 - pos1;
        memcpy(out + pos_out, array_1 + pos1, n_elems * sizeof(uint16_t));
        pos_out += (int32_t)n_elems;
    } else if (pos2 < card_2) {
        const size_t n_elems = card_2 - pos2;
        memcpy(out + pos_out, array_2 + pos2, n_elems * sizeof(uint16_t));
        pos_out += (int32_t)n_elems;
    }
    return pos_out;
}